

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndp.cpp
# Opt level: O0

void __thiscall libDAI::NDP::NDP(NDP *this,FactorGraph *fg,Properties *opts,size_t k)

{
  byte bVar1;
  long lVar2;
  Exception *this_00;
  char *__s;
  ulong uVar3;
  pointer in_RCX;
  long *in_RSI;
  long *in_RDI;
  size_t i_1;
  size_t i;
  reference in_stack_fffffffffffffe88;
  FactorGraph *in_stack_fffffffffffffe90;
  allocator_type *in_stack_fffffffffffffea0;
  FactorGraph *in_stack_fffffffffffffea8;
  DAIAlg<libDAI::FactorGraph> *in_stack_fffffffffffffeb0;
  allocator<char> *in_stack_fffffffffffffec0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  string *msg;
  undefined1 *code;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__x;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_02;
  ulong local_70;
  ulong local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_59;
  undefined1 local_31;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_30;
  long *local_10;
  
  local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_RCX;
  local_10 = in_RSI;
  DAIAlg<libDAI::FactorGraph>::DAIAlg
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
             (Properties *)in_stack_fffffffffffffea0);
  *in_RDI = (long)&PTR_clone_00d4e900;
  in_RDI[0x23] = 0;
  in_RDI[0x24] = 0;
  (**(code **)(*local_10 + 0x28))();
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0xbb5696);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffeb0,
             (size_type)in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0xbb56c2);
  in_RDI[0x28] = 0;
  (**(code **)(*local_10 + 0x28))();
  std::allocator<libDAI::TFactor<double>_>::allocator
            ((allocator<libDAI::TFactor<double>_> *)0xbb5713);
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::vector
            ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
             in_stack_fffffffffffffeb0,(size_type)in_stack_fffffffffffffea8,
             (allocator_type *)in_stack_fffffffffffffea0);
  std::allocator<libDAI::TFactor<double>_>::~allocator
            ((allocator<libDAI::TFactor<double>_> *)0xbb573f);
  (**(code **)(*local_10 + 0x28))();
  std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::allocator
            ((allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)0xbb5785);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)in_stack_fffffffffffffeb0,(size_type)in_stack_fffffffffffffea8,
           (allocator_type *)in_stack_fffffffffffffea0);
  std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::~allocator
            ((allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)0xbb57b1);
  this_02 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x2f);
  (**(code **)(*local_10 + 0x28))();
  __x = &local_30;
  std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::allocator
            ((allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)0xbb57f7);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)in_stack_fffffffffffffeb0,(size_type)in_stack_fffffffffffffea8,
           (allocator_type *)in_stack_fffffffffffffea0);
  std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::~allocator
            ((allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)0xbb5823);
  lVar2 = (**(code **)(*local_10 + 0x48))();
  this_00 = (Exception *)(**(code **)(*local_10 + 0x28))();
  msg = (string *)(&this_00->super_runtime_error + lVar2);
  code = &local_31;
  std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::allocator
            ((allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)0xbb589c);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)in_stack_fffffffffffffeb0,(size_type)in_stack_fffffffffffffea8,
           (allocator_type *)in_stack_fffffffffffffea0);
  std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::~allocator
            ((allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)0xbb58c5);
  in_RDI[0x35] = (long)local_10;
  (**(code **)(*local_10 + 0x28))();
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0xbb5911);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffeb0,
             (size_type)in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0xbb5934);
  in_RDI[0x3a] = (long)local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::
  list<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ::list((list<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
          *)0xbb595c);
  in_RDI[0x3e] = -0x10000000000001;
  bVar1 = (**(code **)(*in_RDI + 0x88))();
  if ((bVar1 & 1) == 0) {
    __s = (char *)__cxa_allocate_exception(0x10);
    this_01 = &local_59;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this_01,__s,in_stack_fffffffffffffec0);
    Exception::Exception(this_00,(size_t)code,msg);
    __cxa_throw(__s,&Exception::typeinfo,Exception::~Exception);
  }
  local_68 = 0;
  while( true ) {
    uVar3 = (**(code **)(*local_10 + 0x28))();
    if (uVar3 <= local_68) break;
    FactorGraph::nbV(in_stack_fffffffffffffe90,(size_t)in_stack_fffffffffffffe88);
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::at((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          *)in_stack_fffffffffffffe90,(size_type)in_stack_fffffffffffffe88);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=(this_02,__x);
    local_68 = local_68 + 1;
  }
  local_70 = 0;
  while( true ) {
    uVar3 = (**(code **)(*local_10 + 0x48))();
    if (uVar3 <= local_70) break;
    in_stack_fffffffffffffe90 =
         (FactorGraph *)
         FactorGraph::nbF(in_stack_fffffffffffffe90,(size_t)in_stack_fffffffffffffe88);
    in_stack_fffffffffffffe88 =
         std::
         vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
         ::at((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               *)in_stack_fffffffffffffe90,(size_type)in_stack_fffffffffffffe88);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=(this_02,__x);
    local_70 = local_70 + 1;
  }
  return;
}

Assistant:

NDP::NDP(const FactorGraph & fg, const Properties &opts, size_t k ) 
        : 
            DAIAlgFG(fg, opts),
            Props(),
            //_maxdiff(0.0),
            //_iterations(0UL),
            //_indices(),
            //_messages(),
            //_newmessages(),
            _m_induced_width(0),
            _m_varOrder( fg.nrVars() ),
            _m_deadlineInSeconds(0),
            _m_newFacs(  fg.nrVars() ),
            _m_bestResps(fg.nrVars() ),
            _m_neighV(   fg.nrVars() ),
            //original factors + the ones that will be introduced.
            _m_neighF(   fg.nrFactors() + fg.nrVars() ),
            _g(&fg) ,
            _m_bestConfiguration( fg.nrVars() ),
            _k(k),
            _k_th_Val(-DBL_MAX)//,
            //writeAnyTimeResults(false),
            //results_f(NULL),
            //timings_f(NULL)
    {
        if( !initProps() )
            DAI_THROW(NOT_ALL_PROPERTIES_SPECIFIED);

        for(size_t i=0; i < fg.nrVars() ; i++)
            //initialize neighborhoods from original model
            _m_neighV.at(i) = fg.nbV(i);
        
        for(size_t i=0; i < fg.nrFactors() ; i++)
            //initialize neighborhoods from original model
            _m_neighF.at(i) = fg.nbF(i);
            //the neighborhoods for the 'new' factors remain uninitialized.

/*        
        // clear messages
        _messages.clear();
        _messages.reserve(grm().nrEdges());

        // clear indices
        _indices.clear();
        _indices.reserve(grm().nrEdges());

        // create messages and indices
        for( size_t iI = 0; iI < grm().nrEdges(); iI++ ) {
            size_t i = grm().edge(iI).first;
            size_t I = grm().edge(iI).second;

            _messages.push_back( Prob( grm().var(i).states() ) );

            vector<size_t> ind( grm().factor(I).stateSpace(), 0 );
            Index indi (grm().var(i), grm().factor(I).vars() );
            for( size_t j = 0; indi >= 0; ++indi,++j )
                ind[j] = indi; 
            _indices.push_back( ind );
        }

        // create new_messages
        _newmessages = _messages;
*/        
    }